

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O1

bool re2::re2_internal::Parse<short>(char *str,size_t n,short *dest,int radix)

{
  bool bVar1;
  long r;
  long local_10;
  
  bVar1 = Parse<long>(str,n,&local_10,radix);
  if ((bVar1) && ((short)local_10 == local_10)) {
    bVar1 = true;
    if (dest != (short *)0x0) {
      *dest = (short)local_10;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Parse(const char* str, size_t n, short* dest, int radix) {
  long r;
  if (!Parse(str, n, &r, radix)) return false;  // Could not parse
  if ((short)r != r) return false;              // Out of range
  if (dest == NULL) return true;
  *dest = (short)r;
  return true;
}